

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCountCharsFromUtf8(char *in_text,char *in_text_end)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  uint *unaff_retaddr;
  uint c;
  int char_count;
  int local_18;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if ((in_RSI == (char *)0x0) || (bVar2 = false, in_RDI < in_RSI)) {
      bVar2 = *in_RDI != '\0';
    }
    if (!bVar2) break;
    iVar1 = ImTextCharFromUtf8(unaff_retaddr,in_RDI,in_RSI);
    in_RDI = in_RDI + iVar1;
    if (local_18 == 0) {
      return local_14;
    }
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int ImTextCountCharsFromUtf8(const char* in_text, const char* in_text_end)
{
    int char_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        char_count++;
    }
    return char_count;
}